

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O2

uint16_t eia608_row_column_pramble(int row,int col,int chan,int underline)

{
  uint16_t uVar1;
  
  uVar1 = eia608_row_pramble(row,chan,col / 4 | 0x10,underline);
  return uVar1;
}

Assistant:

uint16_t eia608_row_column_pramble(int row, int col, int chan, int underline) { return eia608_row_pramble(row, chan, 0x10 | (col / 4), underline); }